

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O3

void __thiscall IndexBuffer::IndexBuffer(IndexBuffer *this,uint32_t count,uint32_t *indices)

{
  this->m_count = count;
  (*glad_glGenBuffers)(1,&this->m_id);
  (*glad_glBindBuffer)(0x8893,this->m_id);
  (*glad_glBufferData)(0x8893,(ulong)count << 2,indices,0x88e4);
  return;
}

Assistant:

IndexBuffer::IndexBuffer(uint32_t count, const uint32_t* indices)
  : m_count(count)
{
#if OPENGL_VERSION >= 45
    glCreateBuffers(1, &m_id);
#else
    glGenBuffers(1, &m_id);
    bind();
#endif

    // GL_ELEMENT_ARRAY_BUFFER is not valid without an actively bound VAO
#if OPENGL_VERSION >= 45
    glNamedBufferStorage(m_id, count * sizeof(uint32_t), indices, GL_DYNAMIC_STORAGE_BIT);
#elif OPENGL_VERSION >= 44
    glBufferStorage(GL_ELEMENT_ARRAY_BUFFER, count * sizeof(uint32_t), indices, 
                    GL_DYNAMIC_STORAGE_BIT);
#else
    glBufferData(GL_ELEMENT_ARRAY_BUFFER, count * sizeof(uint32_t), indices, GL_STATIC_DRAW);
#endif
}